

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schedule.hpp
# Opt level: O0

pair<std::shared_ptr<Schedule>,_int> *
Schedule::fromFile(pair<std::shared_ptr<Schedule>,_int> *__return_storage_ptr__,string *path)

{
  bool bVar1;
  int id;
  element_type *peVar2;
  reference this;
  element_type *peVar3;
  element_type *peVar4;
  undefined8 uVar5;
  shared_ptr<Task> local_2e8;
  undefined1 local_2d8 [8];
  TaskHandle task;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *item;
  iterator __end1;
  iterator __begin1;
  value_type *__range1;
  TaskHandle tail;
  undefined1 local_260 [4];
  int count;
  undefined1 local_250 [8];
  shared_ptr<Schedule> schedule;
  undefined1 local_230 [8];
  json json;
  ifstream file;
  string *path_local;
  
  std::ifstream::ifstream(&json.m_value,path,8);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)local_230,(nullptr_t)0x0);
  nlohmann::operator>>
            ((istream *)&json.m_value.boolean,
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)local_230);
  std::make_shared<Schedule>();
  Common::fromJson((Common *)local_260,(json *)local_230);
  peVar2 = std::__shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_250);
  std::shared_ptr<Common>::operator=(&peVar2->common,(shared_ptr<Common> *)local_260);
  std::shared_ptr<Common>::~shared_ptr((shared_ptr<Common> *)local_260);
  tail.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 0;
  std::shared_ptr<Task>::shared_ptr((shared_ptr<Task> *)&__range1);
  this = nlohmann::
         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
         ::operator[]<char_const>
                   ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                     *)local_230,"code");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::begin((iterator *)&__end1.m_it.primitive_iterator,this);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::end((iterator *)&item,this);
  while( true ) {
    bVar1 = nlohmann::detail::
            iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::operator!=((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)&__end1.m_it.primitive_iterator,
                         (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)&item);
    if (!bVar1) break;
    task.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         nlohmann::detail::
         iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
         ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      *)&__end1.m_it.primitive_iterator);
    id = tail.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ + 1;
    tail.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = id;
    peVar2 = std::__shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_250);
    peVar4 = std::__shared_ptr_access<Common,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Common,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        peVar2);
    Task::fromJson((Task *)local_2d8,id,&peVar4->operands,
                   (json *)task.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&__range1);
    if (bVar1) {
      peVar3 = std::__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &__range1);
      std::shared_ptr<Task>::operator=(&peVar3->next,(shared_ptr<Task> *)local_2d8);
      peVar3 = std::__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          local_2d8);
      std::shared_ptr<Task>::operator=(&peVar3->prev,(shared_ptr<Task> *)&__range1);
      std::shared_ptr<Task>::operator=((shared_ptr<Task> *)&__range1,(shared_ptr<Task> *)local_2d8);
    }
    else {
      peVar2 = std::__shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                          )local_250);
      std::shared_ptr<Task>::operator=(&peVar2->head,(shared_ptr<Task> *)local_2d8);
      std::shared_ptr<Task>::operator=((shared_ptr<Task> *)&__range1,(shared_ptr<Task> *)local_2d8);
    }
    std::shared_ptr<Task>::~shared_ptr((shared_ptr<Task> *)local_2d8);
    nlohmann::detail::
    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator++((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&__end1.m_it.primitive_iterator);
  }
  std::shared_ptr<Task>::shared_ptr(&local_2e8,(nullptr_t)0x0);
  peVar3 = std::__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &__range1);
  std::shared_ptr<Task>::operator=(&peVar3->next,&local_2e8);
  std::shared_ptr<Task>::~shared_ptr(&local_2e8);
  peVar2 = std::__shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_250);
  peVar4 = std::__shared_ptr_access<Common,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Common,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      peVar2);
  peVar2 = std::__shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_250);
  Common::recordAttributes(peVar4,&peVar2->head);
  peVar2 = std::__shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_250);
  peVar4 = std::__shared_ptr_access<Common,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Common,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      peVar2);
  peVar2 = std::__shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_250);
  Common::analyzePlacement(peVar4,&peVar2->head);
  peVar2 = std::__shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_250);
  peVar4 = std::__shared_ptr_access<Common,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Common,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      peVar2);
  peVar2 = std::__shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_250);
  bVar1 = Common::check(peVar4,&peVar2->head);
  if (!bVar1) {
    uVar5 = std::__cxx11::string::c_str();
    error("Origin schedule in file %s check failed.",uVar5);
  }
  peVar2 = std::__shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_250);
  peVar4 = std::__shared_ptr_access<Common,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Common,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      peVar2);
  peVar2 = std::__shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_250);
  Common::analyzeShare(peVar4,&peVar2->head);
  peVar2 = std::__shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_250);
  std::__shared_ptr_access<Common,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Common,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)peVar2);
  peVar2 = std::__shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_250);
  Common::refactor(&peVar2->head);
  std::make_pair<std::shared_ptr<Schedule>&,int&>
            (__return_storage_ptr__,(shared_ptr<Schedule> *)local_250,
             (int *)((long)&tail.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi + 4));
  std::shared_ptr<Task>::~shared_ptr((shared_ptr<Task> *)&__range1);
  std::shared_ptr<Schedule>::~shared_ptr((shared_ptr<Schedule> *)local_250);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)local_230);
  std::ifstream::~ifstream(&json.m_value);
  return __return_storage_ptr__;
}

Assistant:

static std::pair<ScheduleHandle, int> fromFile(const std::string &path) {
        // Read JSON
        std::ifstream file(path);
        nlohmann::json json;
        file >> json;

        // Operands
        auto schedule = std::make_shared<Schedule>();
        schedule->common = Common::fromJson(json);

        // Records
        int count = 0;
        TaskHandle tail;
        for (auto &item: json["code"]) {
            auto task = Task::fromJson(++ count, schedule->common->operands, item);
            if (not tail) {
                schedule->head = task;
                tail = task;
            } else {
                tail->next = task;
                task->prev = tail;
                tail = task;
            }
        }
        tail->next = nullptr;

        // Analyze common elements and refactor to the format without .dealloc and .share
        schedule->common->recordAttributes(schedule->head);
        schedule->common->analyzePlacement(schedule->head);
        if (not schedule->common->check(schedule->head)) {
            error("Origin schedule in file %s check failed.", path.c_str());
        }
        schedule->common->analyzeShare(schedule->head);
        schedule->common->refactor(schedule->head);

        return std::make_pair(schedule, count);
    }